

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savestream.cpp
# Opt level: O1

void __thiscall signalInfo_t::addMetaInfo(signalInfo_t *this,string *method,Value *params)

{
  ostream *poVar1;
  size_t in_RCX;
  undefined1 local_68 [80];
  
  poVar1 = std::ostream::_M_insert<long>((long)&this->metaInfoFile);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(method->_M_dataplus)._M_p,method->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  Json::FastWriter::FastWriter((FastWriter *)(local_68 + 0x20));
  Json::FastWriter::write_abi_cxx11_
            ((FastWriter *)local_68,(int)(FastWriter *)(local_68 + 0x20),params,in_RCX);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)local_68._0_8_,local_68._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_);
  }
  Json::FastWriter::~FastWriter((FastWriter *)(local_68 + 0x20));
  return;
}

Assistant:

void addMetaInfo(const std::string& method, const Json::Value& params)
	{
		metaInfoFile << dataFileNextLine << ": " << method << " " << Json::FastWriter().write(params) << std::endl;
	}